

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O2

void formatter_suite::format_array(void)

{
  basic_variable<std::allocator<char>_> *data_00;
  long lVar1;
  value_type expected [15];
  undefined1 uStack_139;
  variable data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  basic_variable<std::allocator<char>_> local_48;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,"ABC");
  expected._0_7_ = SUB87(&result,0);
  expected[7] = (value_type)((ulong)&result >> 0x38);
  expected[8] = '\x05';
  expected[9] = '\0';
  expected[10] = '\0';
  expected[0xb] = '\0';
  expected[0xc] = '\0';
  expected[0xd] = '\0';
  expected[0xe] = '\0';
  uStack_139 = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&data,(initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                   expected);
  lVar1 = 0xc0;
  do {
    trial::dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
    ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                    *)((long)&result.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  trial::protocol::bintoken::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
            (&result,(bintoken *)&data,data_00);
  expected[8] = '@';
  expected[9] = 0xa9;
  expected[10] = '\x03';
  expected[0xb] = 'A';
  expected[0xc] = 'B';
  expected[0xd] = 'C';
  expected[0xe] = 0x93;
  expected[0] = 0x92;
  expected[1] = 0x82;
  expected[2] = 0x81;
  expected[3] = '\x02';
  expected[4] = 0xc5;
  expected[5] = '\0';
  expected[6] = '\0';
  expected[7] = '@';
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x123,"void formatter_suite::format_array()",
             CONCAT44(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_),
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,expected,&uStack_139);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  return;
}

Assistant:

void format_array()
{
    variable data = { null, true, 2, 3.0f, "ABC" };
    auto result = bintoken::format<buffer_type>(data);
    const value_type expected[] = {
        bintoken::token::code::begin_array,
        bintoken::token::code::null,
        bintoken::token::code::true_value,
        0x02,
        bintoken::token::code::float32, 0x00, 0x00, 0x40, 0x40,
        bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43,
        bintoken::token::code::end_array
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
}